

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

bool __thiscall
cmDepends::Check(cmDepends *this,string *makeFile,string *internalFile,DependencyMap *validDeps)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  long local_238;
  ifstream fin;
  bool local_29;
  bool okay;
  DependencyMap *validDeps_local;
  string *internalFile_local;
  string *makeFile_local;
  cmDepends *this_local;
  
  local_29 = true;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_238,pcVar3,_S_in);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((!bVar1) ||
     (uVar2 = (*this->_vptr_cmDepends[3])(this,&local_238,internalFile,validDeps), (uVar2 & 1) == 0)
     ) {
    Clear(this,makeFile);
    cmsys::SystemTools::RemoveFile(internalFile);
    cmFileTimeCache::Remove(this->FileTimeCache,internalFile);
    local_29 = false;
  }
  std::ifstream::~ifstream(&local_238);
  return local_29;
}

Assistant:

bool cmDepends::Check(const std::string& makeFile,
                      const std::string& internalFile,
                      DependencyMap& validDeps)
{
  // Check whether dependencies must be regenerated.
  bool okay = true;
  cmsys::ifstream fin(internalFile.c_str());
  if (!(fin && this->CheckDependencies(fin, internalFile, validDeps))) {
    // Clear all dependencies so they will be regenerated.
    this->Clear(makeFile);
    cmSystemTools::RemoveFile(internalFile);
    this->FileTimeCache->Remove(internalFile);
    okay = false;
  }
  return okay;
}